

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::
ValidationErrorTest_ExtensionDeclarationsFullNameMissingLeadingDot_Test::
~ValidationErrorTest_ExtensionDeclarationsFullNameMissingLeadingDot_Test
          (ValidationErrorTest_ExtensionDeclarationsFullNameMissingLeadingDot_Test *this)

{
  ValidationErrorTest::~ValidationErrorTest(&this->super_ValidationErrorTest);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, ExtensionDeclarationsFullNameMissingLeadingDot) {
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        message_type {
          name: "Foo"
          extension_range {
            start: 4
            end: 9999
            options: {
              declaration: { number: 10 full_name: "bar" type: "fixed64" }
            }
          }
        }
      )pb",
      "foo.proto: Foo: NAME: \"bar\" must have a leading dot to indicate the "
      "fully-qualified scope.\n");
}